

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

TextureCube * __thiscall tcu::TextureCube::operator=(TextureCube *this,TextureCube *other)

{
  undefined8 *puVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int face_1;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *this_00;
  long lVar7;
  int face;
  long lVar8;
  long lVar9;
  ConstPixelBufferAccess *levels [6];
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68 [7];
  
  if (this != other) {
    uVar2 = other->m_size;
    uVar4 = 0x20;
    if (uVar2 != 0) {
      uVar4 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = uVar4 ^ 0x1f;
    }
    uVar4 = 0x20 - uVar4;
    this_00 = this->m_access;
    lVar8 = 0;
    do {
      std::
      vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
      ::resize((vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                *)(this_00 + -6),(ulong)uVar4);
      std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::resize
                (this_00,(ulong)uVar4);
      local_68[lVar8] =
           (this_00->
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>).
           _M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 1;
      this_00 = this_00 + 1;
    } while (lVar8 != 6);
    this->m_format = other->m_format;
    this->m_size = other->m_size;
    local_78 = (undefined4)local_68[4];
    uStack_74 = (undefined4)((ulong)local_68[4] >> 0x20);
    uStack_70 = (undefined4)local_68[5];
    uStack_6c = (undefined4)((ulong)local_68[5] >> 0x20);
    local_88 = (undefined4)local_68[2];
    uStack_84 = (undefined4)((ulong)local_68[2] >> 0x20);
    uStack_80 = (undefined4)local_68[3];
    uStack_7c = (undefined4)((ulong)local_68[3] >> 0x20);
    local_98 = (undefined4)local_68[0];
    uStack_94 = (undefined4)((ulong)local_68[0] >> 0x20);
    uStack_90 = (undefined4)local_68[1];
    uStack_8c = (undefined4)((ulong)local_68[1] >> 0x20);
    (this->m_view).m_numLevels = uVar4;
    *(ulong *)&(this->m_view).field_0x4 = CONCAT44(local_98,uStack_9c);
    *(ulong *)((long)(this->m_view).m_levels + 4) = CONCAT44(uStack_90,uStack_94);
    *(ulong *)((long)(this->m_view).m_levels + 0xc) = CONCAT44(local_88,uStack_8c);
    *(ulong *)((long)(this->m_view).m_levels + 0x14) = CONCAT44(uStack_80,uStack_84);
    *(ulong *)((long)(this->m_view).m_levels + 0x1c) = CONCAT44(local_78,uStack_7c);
    *(ulong *)((long)(this->m_view).m_levels + 0x24) = CONCAT44(uStack_70,uStack_74);
    *(undefined4 *)((long)(this->m_view).m_levels + 0x2c) = uStack_6c;
    if (uVar2 != 0) {
      uVar5 = 1;
      if (1 < (int)uVar4) {
        uVar5 = (ulong)uVar4;
      }
      uVar6 = 0;
      do {
        lVar7 = 0xa0;
        lVar9 = uVar6 * 0x10;
        lVar8 = 0;
        do {
          lVar3 = *(long *)((long)this + lVar7 + -0x90);
          if (*(long *)(lVar3 + 8 + lVar9) != 0) {
            de::ArrayBuffer<unsigned_char,_1UL,_1UL>::clear
                      ((ArrayBuffer<unsigned_char,_1UL,_1UL> *)(lVar3 + lVar9));
            lVar3 = *(long *)((long)this->m_data + lVar7 + -0x10);
            *(undefined8 *)(lVar3 + uVar6 * 0x28) = 0x2600000015;
            puVar1 = (undefined8 *)(lVar3 + 8 + uVar6 * 0x28);
            *puVar1 = 0;
            puVar1[1] = 0;
            puVar1 = (undefined8 *)(lVar3 + 0x18 + uVar6 * 0x28);
            *puVar1 = 0;
            puVar1[1] = 0;
          }
          if (*(long *)(*(long *)((long)other + lVar7 + -0x90) + 8 + lVar9) != 0) {
            allocLevel(this,(CubeFace)lVar8,(int)uVar6);
            copy((EVP_PKEY_CTX *)(*(long *)((long)this->m_data + lVar7 + -0x10) + uVar6 * 0x28),
                 (EVP_PKEY_CTX *)(*(long *)((long)other->m_data + lVar7 + -0x10) + uVar6 * 0x28));
          }
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + 0x18;
        } while (lVar8 != 6);
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar5);
    }
  }
  return this;
}

Assistant:

TextureCube& TextureCube::operator= (const TextureCube& other)
{
	if (this == &other)
		return *this;

	const int						numLevels		= computeMipPyramidLevels(other.m_size);
	const ConstPixelBufferAccess*	levels[CUBEFACE_LAST];

	for (int face = 0; face < CUBEFACE_LAST; face++)
	{
		m_data[face].resize(numLevels);
		m_access[face].resize(numLevels);
		levels[face] = &m_access[face][0];
	}

	m_format	= other.m_format;
	m_size		= other.m_size;
	m_view		= TextureCubeView(numLevels, levels);

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		for (int face = 0; face < CUBEFACE_LAST; face++)
		{
			if (!isLevelEmpty((CubeFace)face, levelNdx))
				clearLevel((CubeFace)face, levelNdx);

			if (!other.isLevelEmpty((CubeFace)face, levelNdx))
			{
				allocLevel((CubeFace)face, levelNdx);
				copy(getLevelFace(levelNdx, (CubeFace)face),
					 other.getLevelFace(levelNdx, (CubeFace)face));
			}
		}
	}

	return *this;
}